

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O3

void test_multiple_syncs(rtr_socket *socket)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  uint32_t sn;
  uint32_t sn_00;
  long lVar7;
  undefined8 *puVar8;
  uint16_t in_SI;
  uint16_t uVar9;
  aspa_record *records;
  rtr_socket *socket_00;
  long lVar10;
  size_t in_R8;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long in_FS_OFFSET;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_250;
  undefined1 auStack_248 [8];
  ulong local_240;
  ulong local_238;
  size_t local_230;
  rtr_socket *local_228;
  undefined8 *local_220;
  undefined1 *local_218;
  undefined8 *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  undefined1 *local_1f0;
  int local_1e8;
  int local_1e4;
  undefined4 local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  undefined1 local_1b8 [8];
  update_callback _callbacks850 [3];
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  aspa_record _records821 [2];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [8];
  update_callback _callbacks813 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_250 = 0x10694a;
  begin_cache_response((uint8_t)socket,in_SI);
  local_48 = 0x300000002;
  uStack_40 = 0x500000004;
  uStack_250 = 0x106971;
  append_aspa('\x01','\x01',(uint32_t)&local_48,(uint32_t *)0x4,in_R8);
  _callbacks813[1].type = 3;
  _callbacks813[1]._33_7_ = 0x4000000;
  uVar9 = 2;
  uStack_250 = 0x106993;
  append_aspa('\x01','\x02',(int)_callbacks813 + 0x48,(uint32_t *)0x4,in_R8);
  uStack_250 = 0x10699d;
  end_cache_response(0xb5,uVar9,sn);
  expected_callbacks = (update_callback *)local_a8;
  local_a8 = (undefined1  [8])0x0;
  _callbacks813[0].source._0_4_ = 1;
  _callbacks813[0].record.customer_asn = 4;
  _callbacks813[0].record._4_4_ = 0;
  _callbacks813[0].record.provider_count = (size_t)&local_b8;
  local_b8 = 0x300000002;
  uStack_b0 = 0x500000004;
  _callbacks813[0].record.provider_asns._0_1_ = 1;
  _callbacks813[0].type = ASPA_REMOVE;
  _callbacks813[0]._33_7_ = 0;
  _callbacks813[1].source._0_4_ = 2;
  _callbacks813[1].record.customer_asn = 4;
  _callbacks813[1].record._4_4_ = 0;
  _callbacks813[1].record.provider_count = (size_t)&_records821[1].provider_asns;
  _records821[1].provider_asns = (uint32_t *)0x400000003;
  _callbacks813[1].record.provider_asns._0_1_ = 1;
  callback_count = 2;
  callback_index = 0;
  uStack_250 = 0x106a19;
  iVar3 = rtr_sync(socket);
  if (iVar3 != 0) {
    uStack_250 = 0x106e6b;
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x32f,"void test_multiple_syncs(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    records = (aspa_record *)local_f8;
    local_f8._0_4_ = 1;
    _records821[0].customer_asn = 4;
    _records821[0]._4_4_ = 0;
    _records821[0].provider_count = (size_t)&local_108;
    local_108 = 0x300000002;
    uStack_100 = 0x500000004;
    _records821[0].provider_asns._0_4_ = 2;
    _records821[1].customer_asn = 4;
    _records821[1]._4_4_ = 0;
    _records821[1].provider_count = (size_t)&local_118;
    local_118 = 0x400000003;
    uStack_110 = 0x600000005;
    uStack_250 = 0x106a8d;
    socket_00 = socket;
    assert_table(socket,records,2);
    local_220 = &local_22b8;
    local_22b8 = 0x400000003;
    uStack_22b0 = 0x600000005;
    lVar7 = 0x48;
    iVar3 = 2;
    puVar8 = local_220;
    uVar12 = 1;
    local_228 = socket;
    local_218 = auStack_248;
    local_210 = local_220;
    while( true ) {
      iVar5 = (int)uVar12 * 2;
      puVar8[-1] = 0x106aee;
      local_240 = uVar12;
      local_1f4 = iVar3;
      begin_cache_response((uint8_t)socket_00,(uint16_t)records);
      puVar8[-1] = 0x106afc;
      append_aspa('\0',(uint8_t)uVar12,0,(uint32_t *)0x0,in_R8);
      local_1f8 = iVar5 + 2;
      iVar11 = iVar5 + 3;
      iVar4 = iVar5 + 4;
      iVar13 = iVar5 + 5;
      local_1f0 = (undefined1 *)CONCAT44(local_1f0._4_4_,iVar13);
      local_1fc = iVar5 + 1;
      puVar8[-1] = 0x106b63;
      local_204 = iVar4;
      local_200 = iVar11;
      local_128 = local_1f8;
      local_124 = iVar11;
      local_120 = iVar4;
      local_11c = iVar13;
      append_aspa('\x01',(uint8_t)local_1fc,(uint32_t)&local_128,(uint32_t *)0x4,in_R8);
      iVar3 = local_1f8;
      uVar12 = local_240;
      uVar9 = (uint16_t)local_1f8;
      puVar8[-1] = 0x106baa;
      local_138 = iVar11;
      local_134 = iVar4;
      local_130 = iVar13;
      local_12c = iVar5 + 6;
      append_aspa('\x01',(uint8_t)local_1f8,(uint32_t)&local_138,(uint32_t *)0x4,in_R8);
      puVar8[-1] = 0x106bb4;
      end_cache_response(0xbc,uVar9,sn_00);
      iVar4 = local_1fc;
      socket_00 = local_228;
      local_238 = uVar12 + 1;
      local_1c8 = (undefined4)local_238;
      local_230 = uVar12 + 2;
      local_1c4 = (undefined4)local_230;
      _callbacks850[0].source._0_4_ = (int)uVar12;
      local_1c0 = (int)_callbacks850[0].source + 3;
      local_1bc = (int)_callbacks850[0].source + 4;
      local_1b8 = (undefined1  [8])0x0;
      _callbacks850[0].record.customer_asn = 4;
      _callbacks850[0].record._4_4_ = 0;
      _callbacks850[0].record.provider_count = (size_t)&local_1c8;
      _callbacks850[0].record.provider_asns._0_1_ = 0;
      _callbacks850[0].type = ASPA_REMOVE;
      _callbacks850[0]._33_7_ = 0;
      _callbacks850[1].source._0_4_ = local_1fc;
      _callbacks850[1].record.customer_asn = 4;
      _callbacks850[1].record._4_4_ = 0;
      local_1d8 = iVar3;
      _callbacks850[1].record.provider_count = (size_t)&local_1d8;
      _callbacks850[1].record.provider_asns._0_1_ = 1;
      _callbacks850[1].type = ASPA_REMOVE;
      _callbacks850[1]._33_7_ = 0;
      _callbacks850[2].source._0_4_ = iVar3;
      local_1d4 = local_200;
      local_1e8 = local_200;
      local_1d0 = local_204;
      local_1e4 = local_204;
      local_1cc = local_1f0._0_4_;
      local_1e0 = local_1f0._0_4_;
      _callbacks850[2].record.customer_asn = 4;
      _callbacks850[2].record._4_4_ = 0;
      _callbacks850[2].record.provider_count = (size_t)&local_1e8;
      _callbacks850[2].record.provider_asns._0_1_ = 1;
      expected_callbacks = (update_callback *)local_1b8;
      callback_count = 3;
      callback_index = 0;
      puVar8[-1] = 0x106cee;
      local_1dc = iVar5 + 6;
      iVar5 = rtr_sync(local_228);
      iVar3 = local_1f4;
      puVar2 = local_210;
      if (iVar5 != 0) {
        puVar8[-1] = 0x106e4c;
        __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0x353,"void test_multiple_syncs(struct rtr_socket *)");
      }
      if (callback_index != callback_count) break;
      piVar1 = (int *)(local_220 + uVar12 * 4 + -2);
      *piVar1 = iVar4 + 1;
      piVar1[1] = iVar4 + 2;
      piVar1[2] = iVar4 + 3;
      piVar1[3] = iVar4 + 4;
      piVar1 = (int *)(local_220 + uVar12 * 4);
      *piVar1 = iVar4 + 2;
      piVar1[1] = iVar4 + 3;
      piVar1[2] = iVar4 + 4;
      piVar1[3] = iVar4 + 5;
      records = (aspa_record *)((long)puVar8 - (local_230 * 0x18 + 0xf & 0xfffffffffffffff0));
      if (uVar12 < (uVar12 * 2 + 2 & 0xffffffff)) {
        lVar10 = 0;
        puVar6 = local_210;
        iVar5 = local_1f4;
        do {
          *(int *)((long)&records->customer_asn + lVar10) = iVar5;
          *(undefined8 *)((long)&records->provider_count + lVar10) = 4;
          *(undefined8 **)((long)&records->provider_asns + lVar10) = puVar6;
          lVar10 = lVar10 + 0x18;
          iVar5 = iVar5 + 1;
          puVar6 = puVar6 + 2;
        } while (lVar7 != lVar10);
      }
      records[-1].provider_asns = (uint32_t *)0x106db6;
      local_1f0 = (undefined1 *)puVar8;
      assert_table(socket_00,records,local_230);
      lVar7 = lVar7 + 0x18;
      iVar3 = iVar3 + 1;
      local_210 = puVar2 + 2;
      puVar8 = (undefined8 *)local_1f0;
      uVar12 = local_238;
      if (local_238 == 0x104) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        *(code **)(local_218 + -8) = test_many_pdus;
        __stack_chk_fail();
      }
    }
    puVar8[-1] = 0x106e2d;
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x354,"void test_multiple_syncs(struct rtr_socket *)");
  }
  uStack_250 = 0x106e8a;
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x330,"void test_multiple_syncs(struct rtr_socket *)");
}

Assistant:

static void test_multiple_syncs(struct rtr_socket *socket)
{
	const size_t PROVIDER_COUNT = 4;
	// amount of ASPAs to be withdrawn (twice as much are added)
	const size_t N = 256 + 4;

	// initial cycle: add two new aspas
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1, ASNS(2, 3, 4, 5));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2, ASNS(3, 4, 5, 6));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1, ASNS(2, 3, 4, 5))),
		ADDED(RECORD(2, ASNS(3, 4, 5, 6))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1, ASNS(2, 3, 4, 5)),
		RECORD(2, ASNS(3, 4, 5, 6)),
	);

	// repeated cycle: withdraw one, announce two new
	// store expected provider asns, starting with providers for c_an = 2
	uint32_t provider_asns[(2 * N - 1) * PROVIDER_COUNT];

	// enter provider_asns for ASPA record 2 => {3, 4, 5, 6}
	for (size_t i = 0; i < PROVIDER_COUNT; i++)
		provider_asns[i] = i + 3;

	// customer asn to be withdrawn
	for (uint32_t c_wd = 1; c_wd < N; c_wd++) {
		// first customer asn to be announced
		uint32_t c_an = 2 * c_wd + 1;

		begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, c_wd,
			ASNS());
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an,
			ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4));
		APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, c_an + 1,
			ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5));

		end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

		EXPECT_UPDATE_CALLBACKS(
			REMOVED(RECORD(c_wd, ASNS(c_wd + 1, c_wd + 2, c_wd + 3, c_wd + 4))),
			ADDED(RECORD(c_an, ASNS(c_an + 1, c_an + 2, c_an + 3, c_an + 4))),
			ADDED(RECORD(c_an + 1, ASNS(c_an + 2, c_an + 3, c_an + 4, c_an + 5))),
		);
		assert(rtr_sync(socket) == RTR_SUCCESS);
		assert(callback_index == callback_count);

		// store announced ASPAs' providers for validation
		for (size_t i = 0; i < PROVIDER_COUNT; i++) {
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 2) + i] = c_an + (uint32_t)i + 1;
			provider_asns[PROVIDER_COUNT * (size_t)(c_an - 1) + i] = c_an + (uint32_t)i + 2;
		}

		// build array of all records expected to be in aspa_table
		// (customer asns after last withdrawn until including last announced)
		size_t record_count = c_wd + 2;
		struct aspa_record records[record_count];

		for (size_t c_ex = c_wd + 1; c_ex <= c_an + 1; c_ex++) {
			records[c_ex - (c_wd + 1)] =
				((struct aspa_record) {
					.customer_asn = (uint32_t)c_ex,
					.provider_count = PROVIDER_COUNT,
					.provider_asns = &provider_asns[PROVIDER_COUNT * (c_ex - 2)]
				});
		}
		assert_table(socket, records, record_count);
	}
}